

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O3

bool __thiscall DSaveMenu::Responder(DSaveMenu *this,event_t *ev)

{
  BYTE BVar1;
  short sVar2;
  uint uVar3;
  FSaveGameNode *pFVar4;
  bool bVar5;
  int iVar6;
  FBrokenLines *pFVar7;
  char *pcVar8;
  char *pcVar9;
  FName FStack_21c;
  FString aFStack_218 [65];
  
  if ((ev->subtype == '\x01') && (iVar6 = (this->super_DLoadSaveMenu).Selected, iVar6 != -1)) {
    sVar2 = ev->data1;
    if (sVar2 == 8) {
LAB_0030be09:
      if (iVar6 == 0) {
        return true;
      }
      bVar5 = DLoadSaveMenu::Responder(&this->super_DLoadSaveMenu,ev);
      return bVar5;
    }
    if (sVar2 == 0x4e) {
      (this->super_DLoadSaveMenu).Selected = 0;
      (this->super_DLoadSaveMenu).TopItem = 0;
      DLoadSaveMenu::UnloadSaveData(&this->super_DLoadSaveMenu);
      return true;
    }
    if (sVar2 == 0x1a) goto LAB_0030be09;
  }
  if (ev->type == '\x04') {
    BVar1 = ev->subtype;
    if (BVar1 == '\x11') {
      iVar6 = (this->super_DLoadSaveMenu).TopItem;
      if ((int)(DLoadSaveMenu::SaveGames.Count - (this->super_DLoadSaveMenu).listboxRows) <= iVar6)
      {
        return true;
      }
      iVar6 = iVar6 + 1;
    }
    else {
      if (BVar1 != '\x10') {
        if ((BVar1 == '\x01') &&
           (uVar3 = (this->super_DLoadSaveMenu).Selected, uVar3 < DLoadSaveMenu::SaveGames.Count)) {
          sVar2 = ev->data1;
          if ((sVar2 == 8) || (sVar2 == 0x1a)) {
            aFStack_218[0].Chars = FString::NullString.Nothing;
            FString::NullString.RefCount = FString::NullString.RefCount + 1;
            pcVar8 = FStringTable::operator()(&GStrings,"MNU_DELETESG");
            pFVar4 = DLoadSaveMenu::SaveGames.Array[(this->super_DLoadSaveMenu).Selected];
            pcVar9 = FStringTable::operator()(&GStrings,"PRESSYN");
            FString::Format(aFStack_218,"%s\x1cJ%s\x1c-?\n\n%s",pcVar8,pFVar4,pcVar9);
            FStack_21c.Index = 0;
            M_StartMessage(aFStack_218[0].Chars,0,&FStack_21c);
            FString::~FString(aFStack_218);
            return true;
          }
          if (sVar2 == 0xe) {
            if (*(int *)((DLoadSaveMenu::SaveGames.Array[(int)uVar3]->Filename).Chars + -0xc) == 0)
            {
              return true;
            }
            mysnprintf((char *)aFStack_218,0x200,"File on disk:\n%s");
            pFVar7 = (this->super_DLoadSaveMenu).SaveComment;
            if (pFVar7 != (FBrokenLines *)0x0) {
              V_FreeBrokenLines(pFVar7);
            }
            pFVar7 = V_BreakLines(SmallFont,
                                  (((screen->super_DSimpleCanvas).super_DCanvas.Width * 0xd8) /
                                  0x280) / CleanXfac,(BYTE *)aFStack_218,false);
            (this->super_DLoadSaveMenu).SaveComment = pFVar7;
            return true;
          }
        }
        goto LAB_0030b9a6;
      }
      iVar6 = (this->super_DLoadSaveMenu).TopItem;
      if (iVar6 < 1) {
        return true;
      }
      iVar6 = iVar6 + -1;
    }
    (this->super_DLoadSaveMenu).TopItem = iVar6;
    return true;
  }
LAB_0030b9a6:
  bVar5 = DListMenu::Responder((DListMenu *)this,ev);
  return bVar5;
}

Assistant:

bool DSaveMenu::Responder (event_t *ev)
{
	if (ev->subtype == EV_GUI_KeyDown)
	{
		if (Selected != -1)
		{
			switch (ev->data1)
			{
			case GK_DEL:
			case '\b':
				// cannot delete 'new save game' item
				if (Selected == 0) return true;
				break;

			case 'N':
				Selected = TopItem = 0;
				UnloadSaveData ();
				return true;
			}
		}
	}
	return Super::Responder(ev);
}